

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeSORegImmOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t RegNo;
  uint32_t uVar2;
  uint32_t uVar3;
  DecodeStatus In;
  uint imm;
  uint type;
  uint Rm;
  uint Op;
  ARM_AM_ShiftOpc Shift;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Val_local;
  MCInst *Inst_local;
  
  Op = 3;
  _Shift = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Val;
  pMStack_18 = Inst;
  RegNo = fieldFromInstruction_4(Val,0,4);
  uVar2 = fieldFromInstruction_4(Address_local._4_4_,5,2);
  uVar3 = fieldFromInstruction_4(Address_local._4_4_,7,5);
  In = DecodeGPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Shift);
  _Var1 = Check(&Op,In);
  if (_Var1) {
    Rm = 2;
    switch(uVar2) {
    case 0:
      Rm = 2;
      break;
    case 1:
      Rm = 3;
      break;
    case 2:
      Rm = 1;
      break;
    case 3:
      Rm = 4;
    }
    if ((Rm == 4) && (uVar3 == 0)) {
      Rm = 5;
    }
    MCOperand_CreateImm0(pMStack_18,(ulong)(Rm | uVar3 << 3));
    Inst_local._4_4_ = Op;
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeSORegImmOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	ARM_AM_ShiftOpc Shift;
	unsigned Op;
	unsigned Rm = fieldFromInstruction_4(Val, 0, 4);
	unsigned type = fieldFromInstruction_4(Val, 5, 2);
	unsigned imm = fieldFromInstruction_4(Val, 7, 5);

	// Register-immediate
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;

	Shift = ARM_AM_lsl;
	switch (type) {
		case 0:
			Shift = ARM_AM_lsl;
			break;
		case 1:
			Shift = ARM_AM_lsr;
			break;
		case 2:
			Shift = ARM_AM_asr;
			break;
		case 3:
			Shift = ARM_AM_ror;
			break;
	}

	if (Shift == ARM_AM_ror && imm == 0)
		Shift = ARM_AM_rrx;

	Op = Shift | (imm << 3);
	MCOperand_CreateImm0(Inst, Op);

	return S;
}